

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

NodePtr __thiscall avro::resolveSymbol(avro *this,NodePtr *node)

{
  Exception *this_00;
  shared_count extraout_RDX;
  NodePtr NVar1;
  allocator<char> local_41;
  shared_ptr<avro::NodeSymbolic> symNode;
  
  symNode.px = (element_type *)node->px;
  if (((symNode.px)->super_NodeImplSymbolic).super_Node.type_ == AVRO_NUM_TYPES) {
    symNode.pn.pi_ = (node->pn).pi_;
    if (symNode.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (symNode.pn.pi_)->use_count_ = (symNode.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    NodeSymbolic::getNode((NodeSymbolic *)this);
    boost::detail::shared_count::~shared_count(&symNode.pn);
    NVar1.pn.pi_ = extraout_RDX.pi_;
    NVar1.px = (element_type *)this;
    return NVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&symNode,"Only symbolic nodes may be resolved",&local_41);
  Exception::Exception(this_00,(string *)&symNode);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline NodePtr resolveSymbol(const NodePtr &node) 
{
    if(node->type() != AVRO_SYMBOLIC) {
        throw Exception("Only symbolic nodes may be resolved");
    }
    boost::shared_ptr<NodeSymbolic> symNode = boost::static_pointer_cast<NodeSymbolic>(node);
    return symNode->getNode();
}